

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_type.cc
# Opt level: O3

Type * __thiscall Type::MemberDataType(Type *this,ID *member_id)

{
  Env *this_00;
  Type *pTVar1;
  
  if (FLAGS_pac_debug) {
    MemberDataType();
  }
  this_00 = this->env_;
  this_00->allow_undefined_id_ = true;
  pTVar1 = Env::GetDataType(this_00,member_id);
  this->env_->allow_undefined_id_ = false;
  return pTVar1;
}

Assistant:

Type* Type::MemberDataType(const ID* member_id) const
	{
	DEBUG_MSG("MemberDataType: %s::%s\n", type_decl_id_->Name(), member_id->Name());
	ASSERT(env_);
	env_->set_allow_undefined_id(true);
	Type* t = env_->GetDataType(member_id);
	env_->set_allow_undefined_id(false);
	return t;
	}